

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void desc_obj_fake(wchar_t k_idx)

{
  undefined1 local_d0 [8];
  region_conflict area;
  textblock *tb;
  char header [120];
  object *local_38;
  object *known_obj;
  object *obj;
  object *old_obj;
  object_kind *old_kind;
  object_kind *kind;
  wchar_t k_idx_local;
  
  old_kind = k_info + k_idx;
  old_obj = (object *)player->upkeep->object_kind;
  obj = player->upkeep->object;
  kind._4_4_ = k_idx;
  known_obj = object_new();
  local_38 = object_new();
  memset(local_d0,0,0x10);
  track_object_kind(player->upkeep,old_kind);
  handle_stuff(player);
  object_prep(known_obj,old_kind,L'\0',EXTREMIFY);
  if (((old_kind->aware & 1U) != 0) || (old_kind->flavor == (flavor *)0x0)) {
    object_copy(local_38,known_obj);
  }
  known_obj->known = local_38;
  handle_stuff(player);
  area._8_8_ = object_info(known_obj,OINFO_FAKE);
  object_desc((char *)&tb,0x78,known_obj,0xc0,player);
  textui_textblock_show((textblock *)area._8_8_,_local_d0,(char *)&tb);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_38);
  object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
  textblock_free((textblock *)area._8_8_);
  if (old_obj == (object *)0x0) {
    if (obj == (object *)0x0) {
      track_object_cancel(player->upkeep);
    }
    else {
      track_object(player->upkeep,obj);
    }
  }
  else {
    track_object_kind(player->upkeep,(object_kind *)old_obj);
  }
  return;
}

Assistant:

static void desc_obj_fake(int k_idx)
{
	struct object_kind *kind = &k_info[k_idx];
	struct object_kind *old_kind = player->upkeep->object_kind;
	struct object *old_obj = player->upkeep->object;
	struct object *obj = object_new(), *known_obj = object_new();

	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	/* Update the object recall window */
	track_object_kind(player->upkeep, kind);
	handle_stuff(player);

	/* Create the artifact */
	object_prep(obj, kind, 0, EXTREMIFY);

	/* It's fully known */
	if (kind->aware || !kind->flavor)
		object_copy(known_obj, obj);
	obj->known = known_obj;

	/* Hack -- Handle stuff */
	handle_stuff(player);

	tb = object_info(obj, OINFO_FAKE);
	object_desc(header, sizeof(header), obj,
		ODESC_PREFIX | ODESC_CAPITAL, player);

	textui_textblock_show(tb, area, header);
	object_delete(NULL, NULL, &known_obj);
	object_delete(NULL, NULL, &obj);
	textblock_free(tb);

	/* Restore the old trackee */
	if (old_kind)
		track_object_kind(player->upkeep, old_kind);
	else if (old_obj)
		track_object(player->upkeep, old_obj);
	else
		track_object_cancel(player->upkeep);
}